

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::locate
               (Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *section_addresses)

{
  int iVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if ((ulong)(DAT_0013caa8 - table >> 3) <= uVar5) {
      return;
    }
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             (table + uVar5 * 8);
    std::__cxx11::string::string((string *)&local_70,(string *)__rhs);
    uVar4 = Properties<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::get_property(section_addresses,&local_70,uVar4);
    *(uint *)((long)&__rhs[1]._M_dataplus._M_p + 4) = uVar4;
    std::__cxx11::string::~string((string *)&local_70);
    bVar3 = address_is_free((Section *)0x11fd62);
    if (!bVar3) break;
    iVar1 = *(int *)((long)&__rhs[1]._M_dataplus._M_p + 4);
    iVar2 = *(int *)&__rhs[1].field_2;
    if (iVar2 == 0) {
      std::operator+(&local_d0,"Section \"",__rhs);
      std::operator+(&local_50,&local_d0,"\" is empty");
      warning_report(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    uVar4 = iVar1 + iVar2 + 1U & 0xfffffffe;
    uVar5 = uVar5 + 1;
  }
  std::operator+(&local_d0,"Section \"",__rhs);
  uVar4 = *(uint *)((long)&__rhs[1]._M_dataplus._M_p + 4);
  string_printf_abi_cxx11_
            (&local_b0,
             "\" with size %d (0x%x) can\'t be located in address %d (0x%x), this overlap another section.\n"
             ,(ulong)*(uint *)&__rhs[1].field_2,(ulong)*(uint *)&__rhs[1].field_2,(ulong)uVar4,
             (ulong)uVar4);
  std::operator+(&local_90,&local_d0,&local_b0);
  error_report(&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  exit(1);
}

Assistant:

void Sections::locate(Properties<string, unsigned> *section_addresses)
{
	auto current_address = 0;
	for (size_t i = 0; i < table.size(); ++i) {
		Section *section = table[i];
		section->base_address = section_addresses->get_property(section->name, current_address);
		if ( !address_is_free(section)) {
			error_report("Section \"" + section->name
						 + string_printf("\" with size %d (0x%x) can't be located in address %d (0x%x)"
									 ", this overlap another section.\n",
									 section->content_size, section->content_size,
									 section->base_address, section->base_address));
			exit(EXIT_FAILURE);
		}
		// alinhar o início da secção em endereço par
		current_address = align(section->base_address + section->content_size, 1);
		if (section->content_size == 0)
			warning_report("Section \"" + section->name + "\" is empty");
	}
}